

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_safe_arena.h
# Opt level: O2

void * __thiscall
google::protobuf::internal::ThreadSafeArena::
AllocateAligned<(google::protobuf::internal::AllocationClient)1>(ThreadSafeArena *this,size_t n)

{
  long lVar1;
  void *pvVar2;
  
  lVar1 = __tls_get_addr(&PTR_004b29d8);
  if (*(uint64_t *)(lVar1 + 8) == this->tag_and_id_) {
    pvVar2 = SerialArena::AllocateAligned<(google::protobuf::internal::AllocationClient)1>
                       (*(SerialArena **)(lVar1 + 0x10),n);
    return pvVar2;
  }
  pvVar2 = AllocateAlignedFallback<(google::protobuf::internal::AllocationClient)1>(this,n);
  return pvVar2;
}

Assistant:

void* AllocateAligned(size_t n) {
    SerialArena* arena;
    if (PROTOBUF_PREDICT_TRUE(GetSerialArenaFast(&arena))) {
      return arena->AllocateAligned<alloc_client>(n);
    } else {
      return AllocateAlignedFallback<alloc_client>(n);
    }
  }